

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O1

void drawImage2(Array2D<half> *gpx,Array2D<float> *zpx,int w,int h)

{
  short sVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  half *phVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  float p;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float xl;
  
  if (0 < h) {
    lVar8 = gpx->_sizeY;
    phVar9 = gpx->_data;
    lVar12 = zpx->_sizeY;
    pfVar10 = zpx->_data;
    uVar11 = 0;
    do {
      if (0 < w) {
        uVar13 = 0;
        do {
          phVar9[uVar13]._h = 0;
          pfVar10[uVar13] = 3.4028235e+38;
          uVar13 = uVar13 + 1;
        } while ((uint)w != uVar13);
      }
      uVar11 = uVar11 + 1;
      pfVar10 = pfVar10 + lVar12;
      phVar9 = phVar9 + lVar8;
    } while (uVar11 != (uint)h);
  }
  fVar14 = (float)w;
  fVar29 = (float)h + -1.0;
  iVar6 = 0;
  do {
    dVar21 = (double)(((float)(iVar6 * 2) * 3.1415927) / 2000.0);
    dVar22 = sin(dVar21 * 4.0);
    dVar23 = dVar21 * 15.0;
    dVar24 = sin(dVar23);
    dVar25 = cos(dVar21 * 3.0);
    dVar26 = cos(dVar23);
    dVar21 = sin(dVar21 * 5.0);
    dVar23 = sin(dVar23);
    fVar3 = (float)dVar21 * -0.5 + 0.5 + 0.2;
    fVar30 = ((float)(dVar24 * 0.2 + dVar22) * fVar14) / 3.0 + (float)(w / 2);
    fVar4 = (float)(dVar23 * 0.3 + 0.7) * fVar14 * 0.05;
    fVar15 = floorf(fVar30 - fVar4);
    fVar20 = 0.0;
    if (0.0 <= fVar15) {
      fVar20 = fVar15;
    }
    fVar16 = ceilf(fVar30 + fVar4);
    fVar15 = fVar14 + -1.0;
    if (fVar16 <= fVar14 + -1.0) {
      fVar15 = fVar16;
    }
    if ((int)fVar20 <= (int)fVar15) {
      fVar17 = ((float)(dVar26 * 0.2 + dVar25) * (float)h) / 3.0 + (float)(h / 2);
      fVar18 = ceilf(fVar17 + fVar4);
      fVar16 = fVar29;
      if (fVar18 <= fVar29) {
        fVar16 = fVar18;
      }
      fVar19 = floorf(fVar17 - fVar4);
      fVar18 = 0.0;
      if (0.0 <= fVar19) {
        fVar18 = fVar19;
      }
      lVar8 = (long)(int)fVar20;
      do {
        if ((int)fVar18 <= (int)fVar16) {
          fVar20 = ((float)(int)lVar8 - fVar30) / fVar4;
          lVar12 = (long)(int)fVar18;
          do {
            fVar27 = ((float)(int)lVar12 - fVar17) / fVar4;
            fVar19 = fVar20 * fVar20 + fVar27 * fVar27;
            if (fVar19 < 0.0) {
              fVar19 = sqrtf(fVar19);
            }
            else {
              fVar19 = SQRT(fVar19);
            }
            if (fVar19 < 1.0) {
              fVar19 = 1.0 - fVar19 * fVar19;
              if (fVar19 < 0.0) {
                fVar19 = sqrtf(fVar19);
              }
              else {
                fVar19 = SQRT(fVar19);
              }
              fVar31 = -fVar4 * fVar19 + (float)dVar21 * fVar14 + (float)(w * 3);
              if (fVar31 < zpx->_data[zpx->_sizeY * lVar12 + lVar8]) {
                fVar19 = fVar19 * 0.7071 + fVar20 * 0.42426 + fVar27 * -0.56568;
                fVar19 = (float)(-(uint)(fVar19 < 0.0) & (uint)(fVar19 * -0.1) |
                                ~-(uint)(fVar19 < 0.0) & (uint)fVar19);
                uVar11 = 0x32;
                fVar28 = 1.0;
                fVar27 = fVar19;
                do {
                  if ((uVar11 & 1) != 0) {
                    fVar28 = fVar28 * fVar27;
                  }
                  fVar27 = fVar27 * fVar27;
                  uVar7 = (uint)uVar11;
                  uVar11 = uVar11 >> 1;
                } while (1 < uVar7);
                fVar19 = (fVar19 + fVar28 * 4.0) * fVar3 * 2.5 * fVar3;
                lVar2 = gpx->_sizeY;
                phVar9 = gpx->_data;
                if ((fVar19 != 0.0) || (NAN(fVar19))) {
                  sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar19 >> 0x17) * 2);
                  if (sVar1 == 0) {
                    uVar5 = half::convert((int)fVar19);
                  }
                  else {
                    uVar5 = sVar1 + (short)(((uint)fVar19 & 0x7fffff) + 0xfff +
                                            (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd);
                  }
                }
                else {
                  uVar5 = (unsigned_short)((uint)fVar19 >> 0x10);
                }
                phVar9[lVar2 * lVar12 + lVar8]._h = uVar5;
                zpx->_data[zpx->_sizeY * lVar12 + lVar8] = fVar31;
              }
            }
            lVar12 = lVar12 + 1;
          } while ((int)fVar16 + 1 != (int)lVar12);
        }
        lVar8 = lVar8 + 1;
      } while ((int)fVar15 + 1 != (int)lVar8);
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 2000);
  return;
}

Assistant:

void
drawImage2 (Array2D<half> &gpx, Array2D<float> &zpx, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    gpx[y][x] = 0;
	    zpx[y][x] = FLT_MAX;
	}
    }

    int n = 2000;

    for (int i = 0; i < n; ++i)
    {
	float t = (i * 2.0 * M_PI) / n;
	float xp = sin (t * 4.0) + 0.2 * sin (t * 15.0);
	float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
	float zp = sin (t * 5.0);
	float rd = 0.7 + 0.3 * sin (t * 15.0);
	float gn = 0.5 - 0.5 * zp + 0.2;

	zsp (gpx, zpx, w, h,
	     xp * w / 3 + w / 2,
	     yp * h / 3 + h / 2,
	     zp * w + 3 * w,
	     w * rd * 0.05,
	     2.5 * gn * gn);
    }
}